

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_condition(Context_conflict *ctx,uint32 *controls)

{
  int iVar1;
  uint32 uVar2;
  long lVar3;
  
  if (2 < ctx->tokenlen) {
    uVar2 = 1;
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      iVar1 = check_token_segment(ctx,(char *)((long)&parse_condition_comps_rel +
                                              (long)*(int *)((long)&parse_condition_comps_rel +
                                                            lVar3)));
      if (iVar1 != 0) {
        *controls = uVar2;
        return 1;
      }
      uVar2 = uVar2 + 1;
    }
  }
  return 0;
}

Assistant:

static int parse_condition(Context *ctx, uint32 *controls)
{
    static const char *comps[] = { "_gt", "_eq", "_ge", "_lt", "_ne", "_le" };
    size_t i;

    if (ctx->tokenlen >= 3)
    {
        for (i = 0; i < STATICARRAYLEN(comps); i++)
        {
            if (check_token_segment(ctx, comps[i]))
            {
                *controls = (uint32) (i + 1);
                return 1;
            } // if
        } // for
    } // if

    return 0;
}